

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void scalarmultiply(float32 **a,float32 x,int32 n)

{
  int local_20;
  int local_1c;
  int32 j;
  int32 i;
  int32 n_local;
  float32 x_local;
  float32 **a_local;
  
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    a[local_1c][local_1c] = (float32)((float)x * (float)a[local_1c][local_1c]);
    local_20 = local_1c;
    while (local_20 = local_20 + 1, local_20 < n) {
      a[local_1c][local_20] = (float32)((float)x * (float)a[local_1c][local_20]);
      a[local_20][local_1c] = (float32)((float)x * (float)a[local_20][local_1c]);
    }
  }
  return;
}

Assistant:

void
scalarmultiply(float32 ** a, float32 x, int32 n)
{
    int32 i, j;

    for (i = 0; i < n; ++i) {
	a[i][i] *= x;
        for (j = i+1; j < n; ++j) {
            a[i][j] *= x;
            a[j][i] *= x;
	}
    }
}